

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O0

PropertyQueryFlags __thiscall Js::JavascriptProxy::HasItemQuery(JavascriptProxy *this,uint32 index)

{
  anon_class_24_3_139dd0c7 getPropertyId_00;
  BOOL val;
  PropertyQueryFlags PVar1;
  anon_class_24_3_139dd0c7 getPropertyId;
  anon_class_8_1_a81517f2 fn;
  PropertyRecord *propertyRecord;
  JavascriptProxy *pJStack_10;
  uint32 index_local;
  JavascriptProxy *this_local;
  
  getPropertyId_00.index = (uint32 *)((long)&propertyRecord + 4);
  getPropertyId_00.this = this;
  getPropertyId_00.propertyRecord = (PropertyRecord **)&fn;
  propertyRecord._4_4_ = index;
  pJStack_10 = this;
  val = HasPropertyTrap<Js::JavascriptProxy::HasItemQuery(unsigned_int)::__0,Js::JavascriptProxy::HasItemQuery(unsigned_int)::__1>
                  (this,(uint32 *)((long)&propertyRecord + 4),getPropertyId_00);
  PVar1 = JavascriptConversion::BooleanToPropertyQueryFlags(val);
  return PVar1;
}

Assistant:

PropertyQueryFlags JavascriptProxy::HasItemQuery(uint32 index)
    {
        const PropertyRecord* propertyRecord;
        auto fn = [&](RecyclableObject* object)-> BOOL {
            return JavascriptOperators::HasItem(object, index);
        };
        auto getPropertyId = [&]() ->PropertyId {
            PropertyIdFromInt(index, &propertyRecord);
            return propertyRecord->GetPropertyId();
        };
        return JavascriptConversion::BooleanToPropertyQueryFlags(HasPropertyTrap(fn, getPropertyId));
    }